

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall moira::Moira::dump16(Moira *this,char *str,u16 *values,int cnt)

{
  bool bVar1;
  StrWriter *pSVar2;
  UInt16 local_72;
  int local_70;
  int local_6c;
  int j;
  int i;
  StrWriter writer;
  int cnt_local;
  u16 *values_local;
  char *str_local;
  Moira *this_local;
  
  writer._60_4_ = cnt;
  StrWriter::StrWriter((StrWriter *)&j,str,&this->dataStyle);
  for (local_6c = 0; local_6c < (int)writer._60_4_; local_6c = local_6c + 1) {
    local_70 = 0;
    while( true ) {
      bVar1 = false;
      if (local_6c != 0) {
        bVar1 = local_70 < (this->dataStyle).tab;
      }
      if (!bVar1) break;
      StrWriter::operator<<((StrWriter *)&j,' ');
      local_70 = local_70 + 1;
    }
    UInt16::UInt16(&local_72,values[local_6c]);
    pSVar2 = StrWriter::operator<<((StrWriter *)&j,local_72);
    StrWriter::operator<<(pSVar2);
  }
  return;
}

Assistant:

void
Moira::dump16(char *str, u16 values[], int cnt) const
{
    StrWriter writer(str, dataStyle);

    for (int i = 0; i < cnt; i++) {

        for (int j = 0; i && j < dataStyle.tab; j++) writer << ' ';
        writer << UInt16{values[i]} << Finish{};
    }
}